

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subgetopt.c
# Opt level: O2

int subgetopt(int argc,char **argv,char *opts)

{
  int iVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  char cVar5;
  int iVar6;
  long lVar7;
  
  subgetoptarg = (char *)0x0;
  if ((argv == (char **)0x0) || (argc <= subgetoptind)) {
    return subgetoptdone;
  }
  lVar3 = (long)subgetoptind;
  pcVar4 = argv[lVar3];
  if (pcVar4 == (char *)0x0) {
    subgetoptarg = (char *)0x0;
    return subgetoptdone;
  }
  lVar7 = (long)subgetoptpos;
  if (lVar7 == 0) {
LAB_00102a06:
    if (*pcVar4 != '-') {
      subgetoptarg = (char *)0x0;
      return subgetoptdone;
    }
    cVar5 = pcVar4[1];
    if (cVar5 != '\0') {
      if (cVar5 != '-') {
        iVar6 = 2;
        goto LAB_001029b2;
      }
      subgetoptind = subgetoptind + 1;
    }
    subgetoptpos = 0;
    iVar6 = subgetoptdone;
  }
  else {
    if (pcVar4[lVar7] == '\0') {
      subgetoptind = subgetoptind + 1;
      subgetoptpos = 0;
      if (argc <= subgetoptind) {
        subgetoptpos = 0;
        subgetoptarg = (char *)0x0;
        return subgetoptdone;
      }
      pcVar4 = argv[lVar3 + 1];
      if (pcVar4 == (char *)0x0) {
        subgetoptpos = 0;
        subgetoptarg = (char *)0x0;
        return subgetoptdone;
      }
      goto LAB_00102a06;
    }
    cVar5 = pcVar4[lVar7];
    iVar6 = subgetoptpos + 1;
LAB_001029b2:
    iVar2 = (int)cVar5;
    while (iVar1 = subgetoptind, subgetoptpos = iVar6, *opts != '\0') {
      if (cVar5 == *opts) {
        if (opts[1] != ':') {
          subgetoptarg = (char *)0x0;
          return iVar2;
        }
        subgetoptpos = 0;
        iVar1 = subgetoptind + 1;
        if (pcVar4[iVar6] != '\0') {
          subgetoptind = iVar1;
          subgetoptpos = 0;
          subgetoptarg = pcVar4 + iVar6;
          return iVar2;
        }
        subgetoptarg = argv[iVar1];
        if (iVar1 < argc && subgetoptarg != (char *)0x0) {
          subgetoptind = subgetoptind + 2;
          subgetoptpos = 0;
          return iVar2;
        }
        break;
      }
      if (opts[1] == ':') {
        opts = opts + 2;
      }
      else {
        opts = opts + 1;
      }
    }
    subgetoptind = iVar1;
    iVar6 = 0x3f;
    subgetoptproblem = iVar2;
  }
  return iVar6;
}

Assistant:

int sgopt(int argc,const char *const *argv,const char *opts)
{
  int c;
  const char *s;

  optarg = 0;
  if (!argv || (optind >= argc) || !argv[optind]) return optdone;
  if (optpos && !argv[optind][optpos]) {
    ++optind;
    optpos = 0;
    if ((optind >= argc) || !argv[optind]) return optdone;
  }
  if (!optpos) {
    if (argv[optind][0] != '-') return optdone;
    ++optpos;
    c = argv[optind][1];
    if ((c == '-') || (c == 0)) {
      if (c) ++optind;
      optpos = 0;
      return optdone;
    }
    /* otherwise c is reassigned below */
  }
  c = argv[optind][optpos];
  ++optpos;
  s = opts;
  while (*s) {
    if (c == *s) {
      if (s[1] == ':') {
        optarg = argv[optind] + optpos;
        ++optind;
        optpos = 0;
        if (!*optarg) {
          optarg = argv[optind];
          if ((optind >= argc) || !optarg) { /* argument past end */
            optproblem = c;
            return '?';
          }
          ++optind;
        }
      }
      return c;
    }
    ++s;
    if (*s == ':') ++s;
  }
  optproblem = c;
  return '?';
}